

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_traits_name_macro_tests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_376be48::ns::book2a::book2a
          (book2a *this,string *author,string *title,double price)

{
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  undefined8 in_XMM0_Qa;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::__cxx11::string::string(in_RDI + 0x20,in_RDX);
  *(undefined8 *)(in_RDI + 0x40) = in_XMM0_Qa;
  return;
}

Assistant:

book2a(const std::string& author,
              const std::string& title,
              double price)
            : author_(author), title_(title), price_(price)
        {
        }